

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_getglobal(lua_State *L,char *name)

{
  int iVar1;
  TValue *G;
  char *name_local;
  lua_State *L_local;
  
  iVar1 = auxgetstr(L,(TValue *)(*(long *)((L->l_G->l_registry).value_.f + 0x10) + 0x10),name);
  return iVar1;
}

Assistant:

LUA_API int lua_getglobal (lua_State *L, const char *name) {
  const TValue *G;
  lua_lock(L);
  G = getGtable(L);
  return auxgetstr(L, G, name);
}